

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.cc
# Opt level: O1

string * __thiscall
phosg::base64_encode_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,void *vdata,size_t size,char *alphabet)

{
  phosg pVar1;
  phosg pVar2;
  phosg pVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (size == 0) {
    size = (size_t)DEFAULT_ALPHABET;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = ((ulong)vdata / 3) * 3;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      pVar1 = this[uVar5];
      pVar2 = this[uVar5 + 1];
      pVar3 = this[uVar5 + 2];
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,*(char *)(size + ((byte)pVar1 >> 2)));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 *(char *)(size + ((uint)((byte)pVar2 >> 4) | ((byte)pVar1 & 3) << 4)));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 *(char *)(size + ((uint)((byte)pVar3 >> 6) + ((byte)pVar2 & 0xf) * 4)));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,*(char *)(size + ((byte)pVar3 & 0x3f)));
      uVar5 = uVar5 + 3;
    } while (uVar5 < uVar4);
  }
  if ((ulong)vdata % 3 == 1) {
    pVar1 = this[uVar4];
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,*(char *)(size + ((byte)pVar1 >> 2)));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,*(char *)(size + (((byte)pVar1 & 3) << 4)));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'=');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'=');
  }
  else if ((ulong)vdata % 3 == 2) {
    pVar1 = this[uVar4];
    pVar2 = this[uVar4 + 1];
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,*(char *)(size + ((byte)pVar1 >> 2)));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               *(char *)(size + ((uint)((byte)pVar2 >> 4) | ((byte)pVar1 & 3) << 4)));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,*(char *)(size + (ulong)((byte)pVar2 & 0xf) * 4));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'=');
  }
  return __return_storage_ptr__;
}

Assistant:

string base64_encode(const void* vdata, size_t size, const char* alphabet) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);

  if (!alphabet) {
    alphabet = DEFAULT_ALPHABET;
  }

  string ret;

  // encode blocks of 3 bytes first
  size_t end_offset = (size / 3) * 3;
  for (size_t offset = 0; offset < end_offset; offset += 3) {
    // aaaaaabb bbbbcccc ccdddddd
    uint8_t c1 = data[offset];
    uint8_t c2 = data[offset + 1];
    uint8_t c3 = data[offset + 2];
    ret.push_back(alphabet[(c1 >> 2) & 0x3F]);
    ret.push_back(alphabet[((c1 << 4) & 0x30) | ((c2 >> 4) & 0x0F)]);
    ret.push_back(alphabet[((c2 << 2) & 0x3C) | ((c3 >> 6) & 0x03)]);
    ret.push_back(alphabet[c3 & 0x3F]);
  }

  if (size - end_offset == 2) {
    // aaaaaabb bbbbcccc ========
    uint8_t c1 = data[end_offset];
    uint8_t c2 = data[end_offset + 1];
    ret.push_back(alphabet[(c1 >> 2) & 0x3F]);
    ret.push_back(alphabet[((c1 << 4) & 0x30) | ((c2 >> 4) & 0x0F)]);
    ret.push_back(alphabet[((c2 << 2) & 0x3C)]);
    ret.push_back('=');
  } else if (size - end_offset == 1) {
    // aaaaaabb ======== ========
    uint8_t c1 = data[end_offset];
    ret.push_back(alphabet[(c1 >> 2) & 0x3F]);
    ret.push_back(alphabet[((c1 << 4) & 0x30)]);
    ret.push_back('=');
    ret.push_back('=');
  }

  return ret;
}